

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ticket.c
# Opt level: O1

int ssl_ticket_gen_key(mbedtls_ssl_ticket_context *ctx,uchar index)

{
  uchar *puVar1;
  int iVar2;
  time_t tVar3;
  long lVar4;
  uint key_bitlen;
  undefined7 in_register_00000031;
  ulong uVar5;
  uchar buf [32];
  uchar local_38 [32];
  
  uVar5 = (ulong)(uint)((int)CONCAT71(in_register_00000031,index) * 0x60);
  puVar1 = ctx->keys[0].name + uVar5;
  tVar3 = time((time_t *)0x0);
  *(int *)(ctx->keys[0].name + uVar5 + 4) = (int)tVar3;
  iVar2 = (*ctx->f_rng)(ctx->p_rng,puVar1,4);
  if (iVar2 == 0) {
    iVar2 = (*ctx->f_rng)(ctx->p_rng,local_38,0x20);
    if (iVar2 == 0) {
      if (((mbedtls_cipher_context_t *)(puVar1 + 8))->cipher_info == (mbedtls_cipher_info_t *)0x0) {
        key_bitlen = 0;
      }
      else {
        key_bitlen = ((mbedtls_cipher_context_t *)(puVar1 + 8))->cipher_info->key_bitlen;
      }
      iVar2 = mbedtls_cipher_setkey
                        ((mbedtls_cipher_context_t *)(puVar1 + 8),local_38,key_bitlen,
                         MBEDTLS_ENCRYPT);
      lVar4 = 0;
      do {
        local_38[lVar4] = '\0';
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x20);
    }
  }
  return iVar2;
}

Assistant:

static int ssl_ticket_gen_key( mbedtls_ssl_ticket_context *ctx,
                               unsigned char index )
{
    int ret;
    unsigned char buf[MAX_KEY_BYTES];
    mbedtls_ssl_ticket_key *key = ctx->keys + index;

#if defined(MBEDTLS_HAVE_TIME)
    key->generation_time = (uint32_t) mbedtls_time( NULL );
#endif

    if( ( ret = ctx->f_rng( ctx->p_rng, key->name, sizeof( key->name ) ) ) != 0 )
        return( ret );

    if( ( ret = ctx->f_rng( ctx->p_rng, buf, sizeof( buf ) ) ) != 0 )
        return( ret );

    /* With GCM and CCM, same context can encrypt & decrypt */
    ret = mbedtls_cipher_setkey( &key->ctx, buf,
                                 mbedtls_cipher_get_key_bitlen( &key->ctx ),
                                 MBEDTLS_ENCRYPT );

    mbedtls_zeroize( buf, sizeof( buf ) );

    return( ret );
}